

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidget::QCalendarWidget(QCalendarWidget *this,QWidget *parent)

{
  undefined4 uVar1;
  QCalendarWidgetPrivate *pQVar2;
  QCalendarModel *pQVar3;
  undefined8 uVar4;
  QCalendarView *this_00;
  QWidgetPrivate *this_01;
  QLayout *this_02;
  QCalendarModel *this_03;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_04;
  QHeaderView *pQVar5;
  QItemSelectionModel *pQVar6;
  QCalendarDelegate *this_05;
  QCalendarTextNavigator *this_06;
  long in_FS_OFFSET;
  QAnyStringView QVar7;
  QObject local_d8 [8];
  QObject local_d0 [8];
  QObject local_c8 [8];
  QObject local_c0 [8];
  QObject local_b8 [8];
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QBrush local_90 [8];
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QWidgetPrivate *)operator_new(0x2e0);
  QWidgetPrivate::QWidgetPrivate(this_01,QObjectPrivateVersion);
  *(undefined ***)this_01 = &PTR__QCalendarWidgetPrivate_007fd400;
  *(undefined8 *)&this_01[1].field_0x50 = 0;
  *(undefined8 *)
   ((long)&this_01[1].extra._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl + 4) = 0xffffffffffffffff;
  *(undefined8 *)(this_01 + 1) = 0;
  *(undefined8 *)&this_01[1].field_0x8 = 0;
  *(undefined8 *)&this_01[1].field_0x10 = 0;
  *(undefined8 *)&this_01[1].field_0x18 = 0;
  *(undefined8 *)&this_01[1].field_0x19 = 0;
  *(undefined8 *)&this_01[1].field_0x21 = 0;
  *(undefined1 *)
   &this_01[1].extra._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = 1;
  *(undefined4 *)((long)&this_01[1].focus_next + 4) = 0xb;
  QWidget::QWidget(&this->super_QWidget,this_01,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007fca38;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QCalendarWidget_007fcbf0;
  pQVar2 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
  QWidget::setAutoFillBackground(&this->super_QWidget,true);
  QWidget::setBackgroundRole(&this->super_QWidget,Window);
  this_02 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_02,&this->super_QWidget);
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  QLayout::setContentsMargins(this_02,(QMargins *)&local_58);
  this_03 = (QCalendarModel *)operator_new(0xe8);
  QtPrivate::QCalendarModel::QCalendarModel(this_03,(QObject *)this);
  pQVar2->m_model = this_03;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_68);
  QBrush::QBrush(local_90,red,SolidPattern);
  QBrush::operator_cast_to_QVariant((QVariant *)&local_58,local_90);
  QTextFormat::setProperty((int)(QTextFormat *)&local_68,(QVariant *)0x821);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QBrush::~QBrush(local_90);
  pQVar3 = pQVar2->m_model;
  QTextFormat::QTextFormat((QTextFormat *)&local_78,(QTextFormat *)&local_68);
  (pQVar3->m_dayFormats).contained[5] = true;
  uVar4 = *(undefined8 *)((pQVar3->m_dayFormats).data + 5);
  *(undefined8 *)((pQVar3->m_dayFormats).data + 5) = local_78;
  uVar1 = *(undefined4 *)&(pQVar3->m_dayFormats).data[5].field_0x8;
  *(undefined4 *)&(pQVar3->m_dayFormats).data[5].field_0x8 = local_70;
  local_78 = uVar4;
  local_70 = uVar1;
  QTextFormat::~QTextFormat((QTextFormat *)&local_78);
  pQVar3 = pQVar2->m_model;
  QTextFormat::QTextFormat((QTextFormat *)&local_88,(QTextFormat *)&local_68);
  (pQVar3->m_dayFormats).contained[6] = true;
  uVar4 = *(undefined8 *)((pQVar3->m_dayFormats).data + 6);
  *(undefined8 *)((pQVar3->m_dayFormats).data + 6) = local_88;
  uVar1 = *(undefined4 *)&(pQVar3->m_dayFormats).data[6].field_0x8;
  *(undefined4 *)&(pQVar3->m_dayFormats).data[6].field_0x8 = local_80;
  local_88 = uVar4;
  local_80 = uVar1;
  QTextFormat::~QTextFormat((QTextFormat *)&local_88);
  this_04.m_data = operator_new(0x30);
  QtPrivate::QCalendarView::QCalendarView((QCalendarView *)this_04.m_data,&this->super_QWidget);
  pQVar2->m_view = (QCalendarView *)this_04;
  QVar7.m_size = (size_t)"qt_calendar_calendarview";
  QVar7.field_0.m_data = this_04.m_data;
  QObject::setObjectName(QVar7);
  (**(code **)(*(long *)&(pQVar2->m_view->super_QTableView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))();
  this_00 = pQVar2->m_view;
  pQVar2->m_model->m_view = this_00;
  QAbstractItemView::setSelectionBehavior((QAbstractItemView *)this_00,SelectItems);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)pQVar2->m_view,SingleSelection);
  pQVar5 = QTableView::horizontalHeader(&pQVar2->m_view->super_QTableView);
  QHeaderView::setSectionResizeMode(pQVar5,Stretch);
  pQVar5 = QTableView::horizontalHeader(&pQVar2->m_view->super_QTableView);
  QHeaderView::setSectionsClickable(pQVar5,false);
  pQVar5 = QTableView::verticalHeader(&pQVar2->m_view->super_QTableView);
  QHeaderView::setSectionResizeMode(pQVar5,Stretch);
  pQVar5 = QTableView::verticalHeader(&pQVar2->m_view->super_QTableView);
  QHeaderView::setSectionsClickable(pQVar5,false);
  pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)pQVar2->m_view);
  pQVar2->m_selection = pQVar6;
  QCalendarWidgetPrivate::createNavigationBar(pQVar2,&this->super_QWidget);
  QFrame::setFrameStyle((QFrame *)pQVar2->m_view,0);
  this_05 = (QCalendarDelegate *)operator_new(0xe8);
  QStyledItemDelegate::QStyledItemDelegate((QStyledItemDelegate *)this_05,(QObject *)this);
  *(undefined ***)&(this_05->super_QStyledItemDelegate).super_QAbstractItemDelegate =
       &PTR_metaObject_007fd0c8;
  this_05->calendarWidgetPrivate = pQVar2;
  QStyleOptionViewItem::QStyleOptionViewItem(&this_05->storedOption);
  pQVar2->m_delegate = this_05;
  QAbstractItemView::setItemDelegate
            ((QAbstractItemView *)pQVar2->m_view,(QAbstractItemDelegate *)this_05);
  QCalendarWidgetPrivate::update(pQVar2);
  QCalendarWidgetPrivate::updateNavigationBar(pQVar2);
  QWidget::setFocusPolicy(&this->super_QWidget,StrongFocus);
  QWidget::setFocusProxy(&this->super_QWidget,(QWidget *)pQVar2->m_view);
  QWidget::setSizePolicy(&this->super_QWidget,(QSizePolicy)0x550000);
  QObject::connect(local_98,(char *)pQVar2->m_view,(QObject *)"2showDate(QDate)",(char *)this,
                   0x6e1510);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  QObject::connect(local_a0,(char *)pQVar2->m_view,(QObject *)"2changeDate(QDate,bool)",(char *)this
                   ,0x6e1540);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QObject::connect(local_a8,(char *)pQVar2->m_view,(QObject *)"2clicked(QDate)",(char *)this,
                   0x6e155f);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  QObject::connect(local_b0,(char *)pQVar2->m_view,(QObject *)"2editingFinished()",(char *)this,
                   0x6e1446);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  QObject::connect(local_b8,(char *)pQVar2->prevMonth,(QObject *)"2clicked(bool)",(char *)this,
                   0x6e157e);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  QObject::connect(local_c0,(char *)pQVar2->nextMonth,(QObject *)"2clicked(bool)",(char *)this,
                   0x6e1595);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  QObject::connect(local_c8,(char *)pQVar2->yearButton,(QObject *)"2clicked(bool)",(char *)this,
                   0x6e15ac);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  QObject::connect(local_d0,(char *)pQVar2->monthMenu,(QObject *)"2triggered(QAction*)",(char *)this
                   ,0x6e15d3);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  QObject::connect(local_d8,(char *)pQVar2->yearEdit,(QObject *)"2editingFinished()",(char *)this,
                   0x6e15ee);
  QMetaObject::Connection::~Connection((Connection *)local_d8);
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  QLayout::setContentsMargins(this_02,(QMargins *)&local_58);
  (**(code **)(*(long *)this_02 + 0x68))(this_02,0);
  QBoxLayout::addWidget((QBoxLayout *)this_02,pQVar2->navBarBackground,0,(Alignment)0x0);
  QBoxLayout::addWidget((QBoxLayout *)this_02,(QWidget *)pQVar2->m_view,0,(Alignment)0x0);
  this_06 = (QCalendarTextNavigator *)operator_new(0x50);
  QtPrivate::QCalendarTextNavigator::QCalendarTextNavigator(this_06,(QObject *)this);
  pQVar2->m_navigator = this_06;
  pQVar2 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
  if (pQVar2->m_dateEditEnabled == false) {
    pQVar2->m_dateEditEnabled = true;
    QCalendarWidgetPrivate::setNavigatorEnabled(pQVar2,pQVar2->m_view->readOnly == false);
  }
  QTextFormat::~QTextFormat((QTextFormat *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCalendarWidget::QCalendarWidget(QWidget *parent)
    : QWidget(*new QCalendarWidgetPrivate, parent, { })
{
    Q_D(QCalendarWidget);

    setAutoFillBackground(true);
    setBackgroundRole(QPalette::Window);

    QVBoxLayout *layoutV = new QVBoxLayout(this);
    layoutV->setContentsMargins(QMargins());
    d->m_model = new QCalendarModel(this);
    QTextCharFormat fmt;
    fmt.setForeground(QBrush(Qt::red));
    d->m_model->m_dayFormats.insert(Qt::Saturday, fmt);
    d->m_model->m_dayFormats.insert(Qt::Sunday, fmt);
    d->m_view = new QCalendarView(this);
    d->m_view->setObjectName("qt_calendar_calendarview"_L1);
    d->m_view->setModel(d->m_model);
    d->m_model->setView(d->m_view);
    d->m_view->setSelectionBehavior(QAbstractItemView::SelectItems);
    d->m_view->setSelectionMode(QAbstractItemView::SingleSelection);
    d->m_view->horizontalHeader()->setSectionResizeMode(QHeaderView::Stretch);
    d->m_view->horizontalHeader()->setSectionsClickable(false);
    d->m_view->verticalHeader()->setSectionResizeMode(QHeaderView::Stretch);
    d->m_view->verticalHeader()->setSectionsClickable(false);
    d->m_selection = d->m_view->selectionModel();
    d->createNavigationBar(this);
    d->m_view->setFrameStyle(QFrame::NoFrame);
    d->m_delegate = new QCalendarDelegate(d, this);
    d->m_view->setItemDelegate(d->m_delegate);
    d->update();
    d->updateNavigationBar();
    setFocusPolicy(Qt::StrongFocus);
    setFocusProxy(d->m_view);
    setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Preferred);

    connect(d->m_view, SIGNAL(showDate(QDate)),
            this, SLOT(_q_slotShowDate(QDate)));
    connect(d->m_view, SIGNAL(changeDate(QDate,bool)),
            this, SLOT(_q_slotChangeDate(QDate,bool)));
    connect(d->m_view, SIGNAL(clicked(QDate)),
            this, SIGNAL(clicked(QDate)));
    connect(d->m_view, SIGNAL(editingFinished()),
            this, SLOT(_q_editingFinished()));

    connect(d->prevMonth, SIGNAL(clicked(bool)),
            this, SLOT(_q_prevMonthClicked()));
    connect(d->nextMonth, SIGNAL(clicked(bool)),
            this, SLOT(_q_nextMonthClicked()));
    connect(d->yearButton, SIGNAL(clicked(bool)),
            this, SLOT(_q_yearClicked()));
    connect(d->monthMenu, SIGNAL(triggered(QAction*)),
            this, SLOT(_q_monthChanged(QAction*)));
    connect(d->yearEdit, SIGNAL(editingFinished()),
            this, SLOT(_q_yearEditingFinished()));

    layoutV->setContentsMargins(QMargins());
    layoutV->setSpacing(0);
    layoutV->addWidget(d->navBarBackground);
    layoutV->addWidget(d->m_view);

    d->m_navigator = new QCalendarTextNavigator(this);
    setDateEditEnabled(true);
}